

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

int Dau_ParseFormulaAig_rec(Gia_Man_t *p,char *pBeg,char *pEnd)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pEnd_00;
  uint uVar5;
  
  cVar1 = *pBeg;
  uVar5 = 0;
  if (cVar1 == '~') {
    uVar5 = 0;
    do {
      uVar5 = uVar5 ^ 1;
      cVar1 = pBeg[1];
      pBeg = pBeg + 1;
    } while (cVar1 == '~');
  }
  if (pBeg + 1 == pEnd) {
    if ((byte)(cVar1 + 0x9fU) < 6) {
      return uVar5 + (byte)(cVar1 * '\x02' + 0x40);
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                  ,0xb3,"int Dau_ParseFormulaAig_rec(Gia_Man_t *, char *, char *)");
  }
  if ((cVar1 == '(') && (pcVar4 = Dau_ParseFormulaEndToken(pBeg), pcVar4 == pEnd)) {
    if (*pBeg != '(') {
      __assert_fail("pBeg[0] == \'(\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                    ,0xbb,"int Dau_ParseFormulaAig_rec(Gia_Man_t *, char *, char *)");
    }
    if (pBeg[(long)(pEnd + ~(ulong)pBeg)] != ')') {
      __assert_fail("pBeg[pEnd-pBeg-1] == \')\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                    ,0xbc,"int Dau_ParseFormulaAig_rec(Gia_Man_t *, char *, char *)");
    }
    uVar2 = Dau_ParseFormulaAig_rec(p,pBeg + 1,pEnd + -1);
    if (-1 < (int)uVar2) {
      return uVar2 ^ uVar5 != 0;
    }
  }
  else {
    pcVar4 = Dau_ParseFormulaEndToken(pBeg);
    uVar2 = Dau_ParseFormulaAig_rec(p,pBeg,pcVar4);
    if (-1 < (int)uVar2) {
      uVar2 = uVar2 ^ uVar5 != 0;
      cVar1 = *pcVar4;
      pEnd_00 = Dau_ParseFormulaEndToken(pcVar4 + 1);
      iVar3 = Dau_ParseFormulaAig_rec(p,pcVar4 + 1,pEnd_00);
      if (cVar1 == '^') {
        iVar3 = Gia_ManHashXor(p,uVar2,iVar3);
        return iVar3;
      }
      if (cVar1 != '&') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                      ,0xcf,"int Dau_ParseFormulaAig_rec(Gia_Man_t *, char *, char *)");
      }
      iVar3 = Gia_ManHashAnd(p,uVar2,iVar3);
      return iVar3;
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

int Dau_ParseFormulaAig_rec( Gia_Man_t * p, char * pBeg, char * pEnd )
{
    int iFans[2], Res, Oper = -1;
    char * pEndNew;
    int fCompl = 0;
    while ( pBeg[0] == '~' )
    {
        pBeg++;
        fCompl ^= 1;
    }
    if ( pBeg + 1 == pEnd )
    {
        if ( pBeg[0] >= 'a' && pBeg[0] <= 'f' )
            return Abc_Var2Lit( 1 + pBeg[0] - 'a', fCompl );
        assert( 0 );
        return -1;
    }
    if ( pBeg[0] == '(' )
    {
        pEndNew = Dau_ParseFormulaEndToken( pBeg );
        if ( pEndNew == pEnd )
        {
            assert( pBeg[0] == '(' );
            assert( pBeg[pEnd-pBeg-1] == ')' );
            Res = Dau_ParseFormulaAig_rec( p, pBeg + 1, pEnd - 1 );
            return Abc_LitNotCond( Res, fCompl );
        }
    }
    // get first part
    pEndNew  = Dau_ParseFormulaEndToken( pBeg );
    iFans[0] = Dau_ParseFormulaAig_rec( p, pBeg, pEndNew );
    iFans[0] = Abc_LitNotCond( iFans[0], fCompl );
    Oper     = pEndNew[0];
    // get second part
    pBeg     = pEndNew + 1;
    pEndNew  = Dau_ParseFormulaEndToken( pBeg );
    iFans[1] = Dau_ParseFormulaAig_rec( p, pBeg, pEndNew );
    // derive the formula
    if ( Oper == '&' )
        return Gia_ManHashAnd( p, iFans[0], iFans[1] );
    if ( Oper == '^' )
        return Gia_ManHashXor( p, iFans[0], iFans[1] );
    assert( 0 );
    return -1;
}